

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O2

int ON_KnotVectorSpanCount(int order,int cv_count,double *knot)

{
  long lVar1;
  int iVar2;
  
  if (knot == (double *)0x0) {
    if (cv_count == 0 && order == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_knot.cpp"
                 ,0xa6,"","nullptr knot[] passed to ON_KnotVectorSpanCount.");
    }
  }
  else {
    iVar2 = 0;
    for (lVar1 = (long)(order + -1); lVar1 < cv_count; lVar1 = lVar1 + 1) {
      iVar2 = iVar2 + (uint)(knot[lVar1 + -1] <= knot[lVar1] && knot[lVar1] != knot[lVar1 + -1]);
    }
  }
  return iVar2;
}

Assistant:

int ON_KnotVectorSpanCount(
          int order,         // order (>=2)
          int cv_count,      // cv count
          const double* knot // knot[] array
          )
{
  if ( 0 == knot )
  {
    if ( 0 != order || 0 != cv_count )
    {
      ON_ERROR("nullptr knot[] passed to ON_KnotVectorSpanCount.");
    }
    return 0;
  }
  int i, span_count = 0;
  for ( i = order-1; i < cv_count; i++ ) {
    if ( knot[i] > knot[i-1] )
      span_count++;
  }
  return span_count;
}